

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
::
AddUniqueElement<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *a,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *v)

{
  undefined8 uVar1;
  bool bVar2;
  ValueIterator pGVar3;
  undefined1 local_38 [8];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> c;
  ConstValueIterator itr;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *v_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *a_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  c.data_.o.members =
       (Member *)GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Begin(a);
  while( true ) {
    uVar1 = c.data_.o.members;
    pGVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::End(a);
    if ((ValueIterator)uVar1 == pGVar3) {
      GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)local_38,v,
                 *(CrtAllocator **)this,false);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                (a,(GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_38,
                 *(CrtAllocator **)this);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_38);
      return;
    }
    bVar2 = GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                       c.data_.o.members,v);
    if (bVar2) break;
    c.data_.s.str = c.data_.s.str + 0x10;
  }
  return;
}

Assistant:

void AddUniqueElement(V1& a, const V2& v) {
        for (typename V1::ConstValueIterator itr = a.Begin(); itr != a.End(); ++itr)
            if (*itr == v)
                return;
        V1 c(v, *allocator_);
        a.PushBack(c, *allocator_);
    }